

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MergeChunkCallback(Fts5Index *p,void *pCtx,u8 *pChunk,int nChunk)

{
  Fts5SegWriter *pWriter;
  int nChunk_local;
  u8 *pChunk_local;
  void *pCtx_local;
  Fts5Index *p_local;
  
  fts5WriteAppendPoslistData(p,(Fts5SegWriter *)pCtx,pChunk,nChunk);
  return;
}

Assistant:

static void fts5MergeChunkCallback(
  Fts5Index *p, 
  void *pCtx, 
  const u8 *pChunk, int nChunk
){
  Fts5SegWriter *pWriter = (Fts5SegWriter*)pCtx;
  fts5WriteAppendPoslistData(p, pWriter, pChunk, nChunk);
}